

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O2

Maybe<capnp::DynamicValue::Reader> * __thiscall
capnp::compiler::NodeTranslator::readConstant
          (Maybe<capnp::DynamicValue::Reader> *__return_storage_ptr__,NodeTranslator *this,
          Reader source,bool isBootstrap)

{
  Arena *pAVar1;
  _func_int **pp_Var2;
  ErrorReporter *pEVar3;
  Resolver *pRVar4;
  PointerReader reader;
  Builder target;
  Field field;
  ImplicitParams implicitMethodParams;
  undefined1 auVar5 [40];
  PointerReader reader_00;
  Reader name;
  Reader name_00;
  undefined8 uVar6;
  BrandScope *pBVar7;
  char cVar8;
  BrandScope *pBVar9;
  ulong uVar10;
  ConstSchema CVar11;
  uint uVar12;
  undefined8 uVar13;
  char *pcVar14;
  long lVar15;
  long lVar16;
  char (*in_R8) [32];
  ElementCount index;
  ulong uVar17;
  ListSchema schema;
  Reader RVar18;
  StringPtr message;
  StringPtr message_00;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined8 uVar21;
  Builder scope;
  undefined4 uStack_500;
  undefined2 uStack_4fc;
  undefined1 local_4fa;
  undefined1 uStack_4f9;
  undefined4 local_4f8;
  undefined4 uStack_4f4;
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  Reader proto;
  Type constType;
  Schema constSchema;
  Builder bindings;
  undefined7 uStack_458;
  Reader objValue;
  undefined8 local_400;
  ArrayPtr<const_char> local_3d8;
  char *local_3c8;
  long local_3c0;
  Reader constValue;
  Builder constBrand;
  Reader constReader;
  BrandedDecl constDecl;
  ReaderFor<DynamicTypeFor<FromReader<Reader>_>_> dynamicConst;
  MallocMessageBuilder builder;
  
  constDecl.body.tag = 0;
  constDecl.brand.disposer = (Disposer *)0x0;
  constDecl.brand.ptr = (BrandScope *)0x0;
  constDecl.source._reader.segment = (SegmentReader *)0x0;
  constDecl.source._reader.capTable = (CapTableReader *)0x0;
  constDecl.source._reader.data = (void *)0x0;
  constDecl.source._reader.pointers._0_6_ = 0;
  constDecl.source._reader.pointers._6_2_ = 0;
  constDecl.source._reader.dataSize = 0;
  constDecl.source._reader.pointerCount = 0;
  constDecl.source._reader.nestingLimit = 0x7fffffff;
  scope._builder.dataSize = 0;
  scope._builder.pointerCount = 0;
  scope._builder._38_2_ = 0;
  _uStack_500 = 0;
  scope._builder.data = (void *)0x0;
  scope._builder.pointers._0_6_ = 0;
  scope._builder.pointers._6_2_ = 0;
  scope._builder.segment._0_4_ = 0;
  scope._builder.segment._4_4_ = 0;
  scope._builder.capTable = (CapTableBuilder *)0x0;
  local_4fa = INLINE_COMPOSITE;
  local_4f8 = 0x7fffffff;
  uVar19 = local_4f8;
  uVar21 = CONCAT44(uStack_4f4,0x7fffffff);
  uVar13 = CONCAT17(uStack_4f9,0x7000000000000);
  auVar5 = ZEXT2440(ZEXT824(0));
  implicitMethodParams.params.reader.structDataSize = (int)0x7000000000000;
  implicitMethodParams.params.reader.structPointerCount = (short)(0x7000000000000 >> 0x20);
  implicitMethodParams.params.reader.elementSize = (char)(0x7000000000000 >> 0x30);
  implicitMethodParams.params.reader._39_1_ = uStack_4f9;
  implicitMethodParams.scopeId = auVar5._0_8_;
  implicitMethodParams.params.reader.segment = (SegmentReader *)auVar5._8_8_;
  implicitMethodParams.params.reader.capTable = (CapTableReader *)auVar5._16_8_;
  implicitMethodParams.params.reader.ptr = (byte *)auVar5._24_8_;
  implicitMethodParams.params.reader.elementCount = auVar5._32_4_;
  implicitMethodParams.params.reader.step = auVar5._36_4_;
  implicitMethodParams.params.reader._40_8_ = uVar21;
  BrandScope::compileDeclExpression
            ((Maybe<capnp::compiler::NodeTranslator::BrandedDecl> *)&constValue,
             (this->localBrand).ptr,source,this->resolver,implicitMethodParams);
  kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::NullableValue
            ((NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *)&builder,
             (NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *)&constValue);
  kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::~NullableValue
            ((NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *)&constValue);
  cVar8 = (char)builder.super_MessageBuilder._vptr_MessageBuilder;
  if ((char)builder.super_MessageBuilder._vptr_MessageBuilder == '\x01') {
    BrandedDecl::operator=(&constDecl,(BrandedDecl *)builder.super_MessageBuilder.arenaSpace);
  }
  else {
    (__return_storage_ptr__->ptr).isSet = false;
  }
  kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::~NullableValue
            ((NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *)&builder);
  if (cVar8 == '\0') goto LAB_0046b708;
  if ((constDecl.body.tag == 2) || (constDecl.body.field_1._24_2_ != 2)) {
    pEVar3 = this->errorReporter;
    name._reader.capTable = (CapTableReader *)scope._builder.data;
    name._reader.segment = (SegmentReader *)scope._builder.capTable;
    name._reader.data._0_6_ = scope._builder.pointers._0_6_;
    name._reader.data._6_2_ = scope._builder.pointers._6_2_;
    name._reader.pointers._0_4_ = scope._builder.dataSize;
    name._reader.pointers._4_2_ = scope._builder.pointerCount;
    name._reader.pointers._6_2_ = scope._builder._38_2_;
    name._reader.dataSize = 0;
    name._reader.pointerCount = 0;
    name._reader._38_1_ = 7;
    name._reader._39_1_ = uStack_4f9;
    name._reader.nestingLimit = 0x7fffffff;
    name._reader._44_4_ = uStack_4f4;
    expressionString(name);
    kj::str<char_const(&)[2],kj::String,char_const(&)[32]>
              ((String *)&builder,(kj *)0x5685b0,(char (*) [2])&constValue,
               (String *)"\' does not refer to a constant.",in_R8);
    if (builder.super_MessageBuilder.arenaSpace[0] == (void *)0x0) {
      pcVar14 = "";
    }
    else {
      pcVar14 = (char *)CONCAT71(builder.super_MessageBuilder._vptr_MessageBuilder._1_7_,
                                 (char)builder.super_MessageBuilder._vptr_MessageBuilder);
    }
    message.content.size_ =
         (long)builder.super_MessageBuilder.arenaSpace[0] +
         (ulong)(builder.super_MessageBuilder.arenaSpace[0] == (void *)0x0);
    message.content.ptr = pcVar14;
    ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader&>(pEVar3,&source,message);
    kj::Array<char>::~Array((Array<char> *)&builder);
    kj::Array<char>::~Array((Array<char> *)&constValue);
    (__return_storage_ptr__->ptr).isSet = false;
    goto LAB_0046b708;
  }
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x100,GROW_HEURISTICALLY);
  MessageBuilder::getRoot<capnp::schema::Brand>(&constBrand,&builder.super_MessageBuilder);
  pBVar7 = constDecl.brand.ptr;
  if (constDecl.body.tag != 1) {
    kj::_::Debug::Fault::Fault
              ((Fault *)&constValue,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
               ,0x38f,FAILED,"body.is<Resolver::ResolvedDecl>()","");
    kj::_::Debug::Fault::fatal((Fault *)&constValue);
  }
  proto._reader.data = (void *)0x0;
  proto._reader.segment = (SegmentReader *)0x0;
  proto._reader.capTable = (CapTableReader *)0x0;
  pBVar9 = constDecl.brand.ptr;
  do {
    constReader._reader.segment = (SegmentReader *)pBVar9;
    if (((pBVar9->params).size_ != 0) ||
       ((pBVar9->inherited == true && (pBVar9->leafParamCount != 0)))) {
      kj::Vector<capnp::compiler::NodeTranslator::BrandScope*>::
      add<capnp::compiler::NodeTranslator::BrandScope*&>
                ((Vector<capnp::compiler::NodeTranslator::BrandScope*> *)&proto,
                 (BrandScope **)&constReader);
    }
    pBVar9 = (BrandScope *)(constReader._reader.segment)->readLimiter;
  } while (pBVar9 != (BrandScope *)0x0);
  if ((long)proto._reader.capTable - (long)proto._reader.segment != 0) {
    scope._builder.dataSize = constBrand._builder.dataSize;
    scope._builder.pointerCount = constBrand._builder.pointerCount;
    scope._builder._38_2_ = constBrand._builder._38_2_;
    scope._builder.data = constBrand._builder.data;
    scope._builder.pointers._0_6_ = SUB86(constBrand._builder.pointers,0);
    scope._builder.pointers._6_2_ = (undefined2)((ulong)constBrand._builder.pointers >> 0x30);
    scope._builder.segment._0_4_ = SUB84(constBrand._builder.segment,0);
    scope._builder.segment._4_4_ = (undefined4)((ulong)constBrand._builder.segment >> 0x20);
    scope._builder.capTable = constBrand._builder.capTable;
    capnp::schema::Brand::Builder::initScopes
              ((Builder *)&constValue,(Builder *)&scope,
               (uint)((ulong)((long)proto._reader.capTable - (long)proto._reader.segment) >> 3));
    lVar15 = (long)proto._reader.capTable - (long)proto._reader.segment;
    for (uVar17 = 0; uVar17 != lVar15 >> 3; uVar17 = uVar17 + 1) {
      capnp::_::ListBuilder::getStructElement
                (&scope._builder,(ListBuilder *)&constValue,(ElementCount)uVar17);
      pAVar1 = (&(proto._reader.segment)->arena)[uVar17 & 0xffffffff];
      *(_func_int ***)scope._builder.data = pAVar1[5]._vptr_Arena;
      if (*(char *)((long)&pAVar1[6]._vptr_Arena + 4) == '\x01') {
        *(undefined2 *)((long)scope._builder.data + 8) = 1;
      }
      else {
        capnp::schema::Brand::Scope::Builder::initBind
                  (&bindings,(Builder *)&scope._builder,*(uint *)&pAVar1[8]._vptr_Arena);
        uVar10 = (ulong)bindings.builder.elementCount;
        index = 0;
        for (lVar16 = 0; uVar10 * 0xa8 - lVar16 != 0; lVar16 = lVar16 + 0xa8) {
          pp_Var2 = (&(proto._reader.segment)->arena)[uVar17 & 0xffffffff][7]._vptr_Arena;
          pEVar3 = pBVar7->errorReporter;
          capnp::_::ListBuilder::getStructElement
                    ((StructBuilder *)&dynamicConst,&bindings.builder,index);
          capnp::schema::Brand::Binding::Builder::initType
                    ((Builder *)&objValue,(Builder *)&dynamicConst);
          target._builder.capTable._0_4_ = (int)objValue.reader.capTable;
          target._builder.segment = (SegmentBuilder *)objValue.reader.segment;
          target._builder.capTable._4_4_ = (int)((ulong)objValue.reader.capTable >> 0x20);
          target._builder.data._0_4_ = (int)objValue.reader.pointer;
          target._builder.data._4_4_ = (int)((ulong)objValue.reader.pointer >> 0x20);
          target._builder.pointers._0_4_ = objValue.reader.nestingLimit;
          target._builder.pointers._4_4_ = objValue.reader._28_4_;
          target._builder.dataSize = (StructDataBitCount)local_400;
          target._builder._36_4_ = SUB84(local_400,4);
          BrandedDecl::compileAsType((BrandedDecl *)((long)pp_Var2 + lVar16),pEVar3,target);
          index = index + 1;
        }
      }
    }
  }
  kj::ArrayBuilder<capnp::compiler::NodeTranslator::BrandScope_*>::dispose
            ((ArrayBuilder<capnp::compiler::NodeTranslator::BrandScope_*> *)&proto);
  constSchema.raw = (RawBrandedSchema *)(capnp::_::NULL_SCHEMA + 0x48);
  pRVar4 = this->resolver;
  capnp::_::StructBuilder::asReader(&constBrand._builder);
  (*pRVar4->_vptr_Resolver[6])(&constValue,pRVar4,constDecl.body.field_1.forceAligned);
  if ((undefined1)constValue.type == VOID) {
    constSchema.raw = (RawBrandedSchema *)constValue.field_1.enumValue.schema.super_Schema.raw;
    Schema::getProto(&proto,&constSchema);
    if (!isBootstrap) {
      (*this->resolver->_vptr_Resolver[7])
                (&constValue,this->resolver,constDecl.body.field_1.forceAligned);
      if ((undefined1)constValue.type != VOID) goto LAB_0046b3a5;
      proto._reader.segment = constValue.field_1.anyPointerValue.reader.segment;
      proto._reader.capTable = constValue.field_1.anyPointerValue.reader.capTable;
      proto._reader.data = constValue.field_1.listValue.reader.segment;
      proto._reader.pointers = (WirePointer *)constValue.field_1.listValue.reader.capTable;
      proto._reader._32_8_ = constValue.field_1.listValue.reader.ptr;
      proto._reader._40_8_ = constValue.field_1._40_8_;
    }
    constReader._reader.dataSize = proto._reader.dataSize;
    constReader._reader.pointerCount = proto._reader.pointerCount;
    constReader._reader._38_2_ = proto._reader._38_2_;
    constReader._reader.nestingLimit = proto._reader.nestingLimit;
    constReader._reader._44_4_ = proto._reader._44_4_;
    constReader._reader.data = proto._reader.data;
    constReader._reader.pointers = proto._reader.pointers;
    constReader._reader.segment = proto._reader.segment;
    constReader._reader.capTable = proto._reader.capTable;
    capnp::schema::Node::Const::Reader::getValue((Reader *)&constValue,&constReader);
    dynamicConst.reader._32_8_ = constValue.field_1.listValue.reader.capTable;
    dynamicConst.reader._40_8_ = constValue.field_1.listValue.reader.ptr;
    dynamicConst.reader.data = constValue.field_1.structValue.reader.segment;
    dynamicConst.reader.pointers = constValue.field_1.anyPointerValue.reader.pointer;
    dynamicConst.reader.capTable =
         (CapTableReader *)constValue.field_1.anyPointerValue.reader.segment;
    dynamicConst.schema.super_Schema.raw = (Schema)((long)schemas::s_ce23dcd2d7b00c9b + 0x48);
    DynamicStruct::Reader::which((Maybe<capnp::StructSchema::Field> *)&scope,&dynamicConst);
    if ((char)scope._builder.segment != '\x01') {
      kj::_::Debug::Fault::Fault
                ((Fault *)&scope,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
                 ,0xc3a,FAILED,"dynamicConst.which() != nullptr","");
      kj::_::Debug::Fault::fatal((Fault *)&scope);
    }
    uVar6 = CONCAT26(scope._builder._38_2_,
                     CONCAT24(scope._builder.pointerCount,scope._builder.dataSize));
    bindings.builder.segment._7_1_ = SUB81(scope._builder.capTable,0);
    bindings.builder.capTable._0_7_ = (undefined7)((ulong)scope._builder.capTable >> 8);
    bindings.builder.capTable._7_1_ = SUB81(scope._builder.data,0);
    bindings.builder.ptr._0_7_ = (undefined7)((ulong)scope._builder.data >> 8);
    bindings.builder.ptr._7_1_ = (undefined1)scope._builder.pointers._0_6_;
    bindings.builder.elementCount = (ListElementCount)((uint6)scope._builder.pointers._0_6_ >> 8);
    bindings.builder.step._0_3_ =
         (undefined3)(CONCAT26(scope._builder.pointers._6_2_,scope._builder.pointers._0_6_) >> 0x28)
    ;
    bindings.builder.step._3_1_ = (undefined1)scope._builder.dataSize;
    bindings.builder._32_7_ = SUB87((ulong)uVar6 >> 8,0);
    bindings.builder._39_1_ = 0;
    uStack_458 = (undefined7)(CONCAT17(uStack_4f9,0x7000000000000) >> 8);
    field.index = (int)scope._builder.data;
    field.parent.super_Schema.raw = (Schema)(Schema)scope._builder.capTable;
    field._12_4_ = (int)((ulong)scope._builder.data >> 0x20);
    field.proto._reader.segment._0_4_ = (int)scope._builder.pointers._0_6_;
    field.proto._reader.segment._4_4_ =
         (int)(CONCAT26(scope._builder.pointers._6_2_,scope._builder.pointers._0_6_) >> 0x20);
    field.proto._reader.capTable._0_4_ = scope._builder.dataSize;
    field.proto._reader.capTable._4_4_ = (int)((ulong)uVar6 >> 0x20);
    field.proto._reader.data._0_4_ = 0;
    field.proto._reader.data._4_4_ = (int)(CONCAT17(uStack_4f9,0x7000000000000) >> 0x20);
    field.proto._reader.pointers._0_4_ = 0x7fffffff;
    field.proto._reader.pointers._4_4_ = uStack_4f4;
    field.proto._reader._32_8_ = local_4f0;
    field.proto._reader._40_8_ = uStack_4e8;
    DynamicStruct::Reader::get(&constValue,&dynamicConst,field);
    local_4f8 = uVar19;
    if (constValue.type == ANY_POINTER) {
      DynamicValue::Reader::AsImpl<capnp::AnyPointer,_(capnp::Kind)7>::apply(&objValue,&constValue);
      CVar11 = Schema::asConst(&constSchema);
      scope._builder.segment._0_4_ = CVar11.super_Schema.raw._0_4_;
      scope._builder.segment._4_4_ = CVar11.super_Schema.raw._4_4_;
      constType = ConstSchema::getType((ConstSchema *)&scope);
      uVar12 = 0xe;
      if (((undefined1  [16])constType & (undefined1  [16])0xff0000) == (undefined1  [16])0x0) {
        uVar12 = constType._0_4_;
      }
      local_4f8 = 0;
      if ((short)uVar12 == 0xe) {
        schema = Type::asList(&constType);
        reader.capTable._0_4_ = (int)objValue.reader.capTable;
        reader.segment = objValue.reader.segment;
        reader.capTable._4_4_ = (int)((ulong)objValue.reader.capTable >> 0x20);
        reader.pointer._0_4_ = (int)objValue.reader.pointer;
        reader.pointer._4_4_ = (int)((ulong)objValue.reader.pointer >> 0x20);
        reader.nestingLimit = objValue.reader.nestingLimit;
        reader._28_4_ = objValue.reader._28_4_;
        capnp::_::PointerHelpers<capnp::DynamicList,_(capnp::Kind)7>::getDynamic
                  ((Reader *)&bindings,reader,schema);
        scope._builder.segment._0_4_ = 8;
        scope._builder.capTable =
             (CapTableBuilder *)
             CONCAT17(bindings.builder.segment._7_1_,bindings.builder.segment._0_7_);
        scope._builder.data =
             (void *)CONCAT17(bindings.builder.capTable._7_1_,bindings.builder.capTable._0_7_);
        scope._builder.pointers._0_6_ = (undefined6)bindings.builder.ptr._0_7_;
        scope._builder.pointers._6_2_ =
             (undefined2)(CONCAT17(bindings.builder.ptr._7_1_,bindings.builder.ptr._0_7_) >> 0x30);
        scope._builder.dataSize = bindings.builder.elementCount;
        scope._builder.pointerCount = (StructPointerCount)bindings.builder.step;
        scope._builder._38_2_ = SUB42(bindings.builder.step >> 0x10,0);
        _uStack_500 = bindings.builder._32_6_;
        local_4fa = bindings.builder.elementSize;
        uStack_4f9 = bindings.builder._39_1_;
        uStack_4f4 = (undefined4)(CONCAT17(0xff,uStack_458) >> 0x20);
        DynamicValue::Reader::operator=(&constValue,(Reader *)&scope);
        DynamicValue::Reader::~Reader((Reader *)&scope);
      }
      else if ((uVar12 & 0xffff) == 0x10) {
        Type::asStruct(&constType);
        reader_00.capTable = (CapTableReader *)uVar21;
        reader_00.segment = (SegmentReader *)uVar13;
        reader_00.pointer = (WirePointer *)this;
        reader_00.nestingLimit = scope._builder.segment._0_4_;
        reader_00._28_4_ = scope._builder.segment._4_4_;
        capnp::_::PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::getDynamic
                  (reader_00,(StructSchema)objValue.reader.capTable);
        scope._builder.segment._0_4_ = 10;
        scope._builder.capTable =
             (CapTableBuilder *)
             CONCAT17(bindings.builder.segment._7_1_,bindings.builder.segment._0_7_);
        scope._builder.data =
             (void *)CONCAT17(bindings.builder.capTable._7_1_,bindings.builder.capTable._0_7_);
        scope._builder.pointers._0_6_ = (undefined6)bindings.builder.ptr._0_7_;
        scope._builder.pointers._6_2_ =
             (undefined2)(CONCAT17(bindings.builder.ptr._7_1_,bindings.builder.ptr._0_7_) >> 0x30);
        scope._builder.dataSize = bindings.builder.elementCount;
        scope._builder.pointerCount = (StructPointerCount)bindings.builder.step;
        scope._builder._38_2_ = SUB42(bindings.builder.step >> 0x10,0);
        _uStack_500 = bindings.builder._32_6_;
        local_4fa = bindings.builder.elementSize;
        uStack_4f9 = bindings.builder._39_1_;
        uStack_4f4 = (undefined4)(CONCAT17(0xff,uStack_458) >> 0x20);
        DynamicValue::Reader::operator=(&constValue,(Reader *)&scope);
        DynamicValue::Reader::~Reader((Reader *)&scope);
      }
      else {
        local_4f8 = uVar19;
        if ((uVar12 & 0xffff) != 0x12) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[55]>
                    ((Fault *)&scope,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
                     ,0xc4c,FAILED,(char *)0x0,
                     "\"Unrecognized AnyPointer-typed member of schema::Value.\"",
                     (char (*) [55])"Unrecognized AnyPointer-typed member of schema::Value.");
          kj::_::Debug::Fault::fatal((Fault *)&scope);
        }
      }
    }
    if ((0xf < source._reader.dataSize) && (*source._reader.data == 5)) {
      if (proto._reader.dataSize < 0xc0) {
        uVar13 = 0;
      }
      else {
        uVar13 = *(undefined8 *)((long)proto._reader.data + 0x10);
      }
      (*this->resolver->_vptr_Resolver[6])(&scope,this->resolver,uVar13);
      constType.baseType._0_1_ = (char)scope._builder.segment;
      if ((char)scope._builder.segment == '\x01') {
        constType.field_4.schema = (RawBrandedSchema *)scope._builder.capTable;
        Schema::getProto((Reader *)&scope,(Schema *)&constType.field_4);
        local_3c0 = 1;
        local_3c8 = "";
        if ((0x6f < scope._builder.dataSize) && (*(short *)((long)scope._builder.data + 0xc) != 0))
        {
          RVar18 = capnp::schema::Node::Reader::getDisplayName((Reader *)&scope);
          if (scope._builder.dataSize < 0x60) {
            uVar17 = 0;
          }
          else {
            uVar17 = (ulong)*(uint *)((long)scope._builder.data + 8);
          }
          local_3c8 = RVar18.super_StringPtr.content.ptr + uVar17;
          local_3c0 = RVar18.super_StringPtr.content.size_ - uVar17;
        }
        Expression::Reader::getRelativeName((Reader *)&bindings,&source);
        local_3d8 = (ArrayPtr<const_char>)LocatedText::Reader::getValue((Reader *)&bindings);
        pEVar3 = this->errorReporter;
        uVar19 = SUB84(source._reader.data,0);
        uVar20 = (undefined4)((ulong)source._reader.data >> 0x20);
        name_00._reader.capTable = (CapTableReader *)scope._builder.data;
        name_00._reader.segment = (SegmentReader *)scope._builder.capTable;
        name_00._reader.data._0_6_ = scope._builder.pointers._0_6_;
        name_00._reader.data._6_2_ = scope._builder.pointers._6_2_;
        name_00._reader.pointers._0_4_ = scope._builder.dataSize;
        name_00._reader.pointers._4_2_ = scope._builder.pointerCount;
        name_00._reader.pointers._6_2_ = scope._builder._38_2_;
        name_00._reader.dataSize = uStack_500;
        name_00._reader.pointerCount = uStack_4fc;
        name_00._reader._38_1_ = local_4fa;
        name_00._reader._39_1_ = uStack_4f9;
        name_00._reader.nestingLimit = local_4f8;
        name_00._reader._44_4_ = uStack_4f4;
        expressionString(name_00);
        kj::
        str<char_const(&)[71],kj::String,char_const(&)[9],kj::StringPtr&,char_const(&)[2],kj::StringPtr&,char_const(&)[32]>
                  ((String *)&bindings,
                   (kj *)"Constant names must be qualified to avoid confusion.  Please replace \'",
                   (char (*) [71])&objValue,(String *)"\' with \'",(char (*) [9])&local_3c8,
                   (StringPtr *)0x5795aa,(char (*) [2])&local_3d8,
                   (StringPtr *)"\', if that\'s what you intended.",
                   (char (*) [32])CONCAT44(uVar20,uVar19));
        lVar15 = CONCAT17(bindings.builder.capTable._7_1_,bindings.builder.capTable._0_7_);
        if (lVar15 == 0) {
          pcVar14 = "";
        }
        else {
          pcVar14 = (char *)CONCAT17(bindings.builder.segment._7_1_,bindings.builder.segment._0_7_);
        }
        message_00.content.size_ = lVar15 + (ulong)(lVar15 == 0);
        message_00.content.ptr = pcVar14;
        ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader&>(pEVar3,&source,message_00);
        kj::Array<char>::~Array((Array<char> *)&bindings);
        kj::Array<char>::~Array((Array<char> *)&objValue);
      }
    }
    kj::_::NullableValue<capnp::DynamicValue::Reader>::NullableValue
              (&__return_storage_ptr__->ptr,&constValue);
    DynamicValue::Reader::~Reader(&constValue);
  }
  else {
LAB_0046b3a5:
    (__return_storage_ptr__->ptr).isSet = false;
  }
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
LAB_0046b708:
  BrandedDecl::~BrandedDecl(&constDecl);
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<DynamicValue::Reader> NodeTranslator::readConstant(
    Expression::Reader source, bool isBootstrap) {
  // Look up the constant decl.
  NodeTranslator::BrandedDecl constDecl = nullptr;
  KJ_IF_MAYBE(decl, compileDeclExpression(source, noImplicitParams())) {
    constDecl = *decl;
  } else {
    // Lookup will have reported an error.
    return nullptr;
  }

  // Is it a constant?
  if(constDecl.getKind().orDefault(Declaration::FILE) != Declaration::CONST) {
    errorReporter.addErrorOn(source,
        kj::str("'", expressionString(source), "' does not refer to a constant."));
    return nullptr;
  }

  // Extract the ID and brand.
  MallocMessageBuilder builder(256);
  auto constBrand = builder.getRoot<schema::Brand>();
  uint64_t id = constDecl.getIdAndFillBrand([&]() { return constBrand; });

  // Look up the schema -- we'll need this to compile the constant's type.
  Schema constSchema;
  KJ_IF_MAYBE(s, resolver.resolveBootstrapSchema(id, constBrand)) {
    constSchema = *s;
  } else {
    // The constant's schema is broken for reasons already reported.
    return nullptr;
  }

  // If we're bootstrapping, then we know we're expecting a primitive value, so if the
  // constant turns out to be non-primitive, we'll error out anyway.  If we're not
  // bootstrapping, we may be compiling a non-primitive value and so we need the final
  // version of the constant to make sure its value is filled in.
  schema::Node::Reader proto = constSchema.getProto();
  if (!isBootstrap) {
    KJ_IF_MAYBE(finalProto, resolver.resolveFinalSchema(id)) {
      proto = *finalProto;
    } else {
      // The constant's final schema is broken for reasons already reported.
      return nullptr;
    }
  }

  auto constReader = proto.getConst();
  auto dynamicConst = toDynamic(constReader.getValue());
  auto constValue = dynamicConst.get(KJ_ASSERT_NONNULL(dynamicConst.which()));

  if (constValue.getType() == DynamicValue::ANY_POINTER) {
    // We need to assign an appropriate schema to this pointer.
    AnyPointer::Reader objValue = constValue.as<AnyPointer>();

    auto constType = constSchema.asConst().getType();
    switch (constType.which()) {
      case schema::Type::STRUCT:
        constValue = objValue.getAs<DynamicStruct>(constType.asStruct());
        break;
      case schema::Type::LIST:
        constValue = objValue.getAs<DynamicList>(constType.asList());
        break;
      case schema::Type::ANY_POINTER:
        // Fine as-is.
        break;
      default:
        KJ_FAIL_ASSERT("Unrecognized AnyPointer-typed member of schema::Value.");
        break;
    }
  }

  if (source.isRelativeName()) {
    // A fully unqualified identifier looks like it might refer to a constant visible in the
    // current scope, but if that's really what the user wanted, we want them to use a
    // qualified name to make it more obvious.  Report an error.
    KJ_IF_MAYBE(scope, resolver.resolveBootstrapSchema(proto.getScopeId(),
                                                       schema::Brand::Reader())) {
      auto scopeReader = scope->getProto();
      kj::StringPtr parent;
      if (scopeReader.isFile()) {
        parent = "";
      } else {
        parent = scopeReader.getDisplayName().slice(scopeReader.getDisplayNamePrefixLength());
      }
      kj::StringPtr id = source.getRelativeName().getValue();

      errorReporter.addErrorOn(source, kj::str(
          "Constant names must be qualified to avoid confusion.  Please replace '",
          expressionString(source), "' with '", parent, ".", id,
          "', if that's what you intended."));
    }
  }

  return constValue;
}